

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

TFilterCoefficients * calculateCoefficientsSecondOrderButterworthHighPass(int fc,int fs)

{
  float fVar1;
  int in_EDX;
  int in_ESI;
  TFilterCoefficients *in_RDI;
  float fVar2;
  double dVar3;
  TFilterCoefficients *res;
  float c;
  
  TFilterCoefficients::TFilterCoefficients(in_RDI);
  dVar3 = tan(((double)in_ESI * 3.141592653589793) / (double)in_EDX);
  fVar2 = (float)dVar3;
  dVar3 = pow((double)fVar2,2.0);
  in_RDI->a0 = (float)(1.0 / ((double)fVar2 * 1.4142135623730951 + 1.0 + dVar3));
  in_RDI->a1 = in_RDI->a0 * -2.0;
  in_RDI->a2 = in_RDI->a0;
  fVar1 = in_RDI->a0;
  dVar3 = pow((double)fVar2,2.0);
  in_RDI->b1 = (float)((double)fVar1 * 2.0 * (dVar3 - 1.0));
  fVar1 = in_RDI->a0;
  dVar3 = pow((double)fVar2,2.0);
  in_RDI->b2 = (float)((double)fVar1 * ((double)fVar2 * -1.4142135623730951 + 1.0 + dVar3));
  return in_RDI;
}

Assistant:

TFilterCoefficients calculateCoefficientsSecondOrderButterworthHighPass(int fc, int fs) {
    TFilterCoefficients res;

    float c = tan(pi*fc / fs);
    res.a0 = 1.0 / (1.0 + sqrt2*c + pow(c, 2.0));
    res.a1 = -2.0 * res.a0;
    res.a2 = res.a0;
    res.b1 = 2.0 * res.a0*(pow(c, 2.0) - 1.0);
    res.b2 = res.a0 * (1.0 - sqrt2*c + pow(c, 2.0));

    return res;
}